

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

uint64_t __thiscall llvm::raw_fd_ostream::seek(raw_fd_ostream *this,uint64_t off)

{
  int __v;
  uint64_t uVar1;
  int *piVar2;
  error_category *__cat;
  error_code EC;
  error_code local_28;
  uint64_t local_18;
  uint64_t off_local;
  raw_fd_ostream *this_local;
  
  local_18 = off;
  off_local = (uint64_t)this;
  if ((this->SupportsSeeking & 1U) == 0) {
    __assert_fail("SupportsSeeking && \"Stream does not support seeking!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x2a4,"uint64_t llvm::raw_fd_ostream::seek(uint64_t)");
  }
  raw_ostream::flush((raw_ostream *)this);
  uVar1 = lseek(this->FD,local_18,0);
  this->pos = uVar1;
  if (this->pos == 0xffffffffffffffff) {
    piVar2 = __errno_location();
    __v = *piVar2;
    __cat = (error_category *)std::_V2::generic_category();
    std::error_code::error_code(&local_28,__v,__cat);
    EC._4_4_ = 0;
    EC._M_value = local_28._M_value;
    EC._M_cat = local_28._M_cat;
    error_detected(this,EC);
  }
  return this->pos;
}

Assistant:

uint64_t raw_fd_ostream::seek(uint64_t off) {
  assert(SupportsSeeking && "Stream does not support seeking!");
  flush();
#ifdef _WIN32
  pos = ::_lseeki64(FD, off, SEEK_SET);
#elif defined(HAVE_LSEEK64)
  pos = ::lseek64(FD, off, SEEK_SET);
#else
  pos = ::lseek(FD, off, SEEK_SET);
#endif
  if (pos == (uint64_t)-1)
    error_detected(std::error_code(errno, std::generic_category()));
  return pos;
}